

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void insertElement(Hash *pH,_ht *pEntry,HashElem *pNew)

{
  HashElem *pHVar1;
  HashElem *pHVar2;
  HashElem **ppHVar3;
  
  if (pEntry == (_ht *)0x0) {
    pHVar1 = (HashElem *)0x0;
  }
  else {
    if (pEntry->count == 0) {
      pHVar1 = (HashElem *)0x0;
    }
    else {
      pHVar1 = pEntry->chain;
    }
    pEntry->count = pEntry->count + 1;
    pEntry->chain = pNew;
  }
  if (pHVar1 == (HashElem *)0x0) {
    pHVar1 = pH->first;
    pNew->next = pHVar1;
    if (pHVar1 != (HashElem *)0x0) {
      pHVar1->prev = pNew;
    }
    ppHVar3 = &pH->first;
    pNew->prev = (HashElem *)0x0;
  }
  else {
    pNew->next = pHVar1;
    ppHVar3 = &pHVar1->prev;
    pNew->prev = pHVar1->prev;
    pHVar2 = (HashElem *)&pH->first;
    if (pHVar1->prev != (HashElem *)0x0) {
      pHVar2 = pHVar1->prev;
    }
    pHVar2->next = pNew;
  }
  *ppHVar3 = pNew;
  return;
}

Assistant:

static void insertElement(
  Hash *pH,              /* The complete hash table */
  struct _ht *pEntry,    /* The entry into which pNew is inserted */
  HashElem *pNew         /* The element to be inserted */
){
  HashElem *pHead;       /* First element already in pEntry */
  if( pEntry ){
    pHead = pEntry->count ? pEntry->chain : 0;
    pEntry->count++;
    pEntry->chain = pNew;
  }else{
    pHead = 0;
  }
  if( pHead ){
    pNew->next = pHead;
    pNew->prev = pHead->prev;
    if( pHead->prev ){ pHead->prev->next = pNew; }
    else             { pH->first = pNew; }
    pHead->prev = pNew;
  }else{
    pNew->next = pH->first;
    if( pH->first ){ pH->first->prev = pNew; }
    pNew->prev = 0;
    pH->first = pNew;
  }
}